

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O1

double __thiscall
SnareDrumOperator::getOperatorOutput(SnareDrumOperator *this,OPL3 *OPL3,double modulator)

{
  int iVar1;
  OperatorDataStruct *pOVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar4 = 0.0;
  if ((this->super_Operator).envelopeGenerator.stage != OFF) {
    dVar4 = EnvelopeGenerator::getEnvelope
                      (&(this->super_Operator).envelopeGenerator,OPL3,(this->super_Operator).egt,
                       (this->super_Operator).am);
    dVar5 = 0.0;
    if (-120.0 <= dVar4) {
      dVar5 = ::OPL3::OperatorData->dbpow[SUB84(dVar4 * -4.0 + 6755399441055744.0,0)];
    }
    (this->super_Operator).envelope = dVar5;
    pOVar2 = ::OPL3::OperatorData;
    iVar1 = OPL3->_new;
    dVar4 = (OPL3->highHatOperator).super_TopCymbalOperator.super_Operator.phase;
    dVar4 = dVar4 + dVar4;
    (this->super_Operator).phase = dVar4;
    dVar5 = dVar5 * pOVar2->waveforms[((long)(iVar1 << 2) | 3U) & (long)(this->super_Operator).ws]
                    [SUB84((dVar4 + modulator) * 1024.0 + 6755399441055744.0,0) & 0x3ff];
    uVar3 = FRandom::GenRand32(&pr_opl3);
    dVar7 = (this->super_Operator).envelope;
    dVar6 = dVar5 / dVar7;
    dVar4 = dVar5;
    if ((dVar6 != 1.0) && (dVar6 != -1.0)) {
      dVar7 = (double)uVar3 * 2.3283064370807974e-10 * dVar7;
      dVar4 = dVar7;
      if ((dVar5 <= 0.0) && (dVar4 = 0.0, dVar5 < 0.0)) {
        dVar4 = -dVar7;
      }
    }
    dVar4 = dVar4 + dVar4;
  }
  return dVar4;
}

Assistant:

double SnareDrumOperator::getOperatorOutput(OPL3 *OPL3, double modulator) {
	if(envelopeGenerator.stage == EnvelopeGenerator::OFF) return 0;
	
	double envelopeInDB = envelopeGenerator.getEnvelope(OPL3, egt, am);
	envelope = EnvelopeFromDB(envelopeInDB);
	
	// If it is in OPL2 mode, use first four waveforms only:
	int waveIndex = ws & ((OPL3->_new<<2) + 3); 
	double *waveform = OPL3::OperatorData->waveforms[waveIndex];
	
	phase = OPL3->highHatOperator.phase * 2;
	
	double operatorOutput = getOutput(modulator, phase, waveform);

	double noise = pr_opl3.GenRand_Real1() * envelope;        
	
	if(operatorOutput/envelope != 1 && operatorOutput/envelope != -1) {
		if(operatorOutput > 0)  operatorOutput = noise;
		else if(operatorOutput < 0) operatorOutput = -noise;
		else operatorOutput = 0;            
	}
	
	return operatorOutput*2;
}